

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_lookup_path_modify(Tree *this,lookup_result *r)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  csubstr cVar4;
  _lookup_path_token parent;
  _lookup_path_token local_38;
  
  cVar4 = lookup_result::unresolved(r);
  if ((cVar4.len != 0) && (cVar4.str != (char *)0x0)) {
    local_38.type = type(this,r->closest);
    local_38.value.str = "";
    local_38.value.len = 0;
    while( true ) {
      sVar3 = _next_node_modify(this,r,&local_38);
      if (sVar3 != 0xffffffffffffffff) {
        r->closest = sVar3;
      }
      cVar4 = lookup_result::unresolved(r);
      if ((cVar4.len == 0) || (cVar4.str == (char *)0x0)) break;
      if (sVar3 == 0xffffffffffffffff) {
        return;
      }
    }
    r->target = sVar3;
    return;
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  handle_error(0x22b919,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x68f9,"! r->unresolved().empty()");
}

Assistant:

void Tree::_lookup_path_modify(lookup_result *r)
{
    C4_ASSERT( ! r->unresolved().empty());
    _lookup_path_token parent{"", type(r->closest)};
    size_t node;
    do
    {
        node = _next_node_modify(r, &parent);
        if(node != NONE)
            r->closest = node;
        if(r->unresolved().empty())
        {
            r->target = node;
            return;
        }
    } while(node != NONE);
}